

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::GLES2ThreadedSharingTest::init(GLES2ThreadedSharingTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  value_type pEVar1;
  Library *pLVar2;
  deUint32 dVar3;
  int extraout_EAX;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar4;
  EGLConfig pvVar5;
  EGLThread *pEVar6;
  reference ppEVar7;
  CreateContext *pCVar8;
  CreatePBufferSurface *pCVar9;
  MakeCurrent *pMVar10;
  InitGLExtension *pIVar11;
  DestroyContext *pDVar12;
  DestroySurface *pDVar13;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_1c8;
  undefined1 local_1b1;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_1b0;
  undefined1 local_199;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_198;
  undefined1 local_181;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_180;
  undefined1 local_169;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_168;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_158;
  undefined1 local_141;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_140;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_130;
  undefined1 local_119;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_118;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_108;
  undefined1 local_f1;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_f0;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> local_e0;
  undefined1 local_c9;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_c8;
  undefined1 local_b1;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> local_b0;
  undefined1 local_a0 [8];
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> surface2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> surface1;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> contex2;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> contex1;
  EGLThread *local_48;
  deUint32 local_3c;
  EGLint local_38 [2];
  EGLint attribList [7];
  Library *egl;
  GLES2ThreadedSharingTest *this_local;
  
  register0x00000000 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_38[0] = 0x3040;
  local_38[1] = 4;
  attribList[0] = 0x3033;
  attribList[1] = 4;
  attribList[2] = 0x3021;
  attribList[3] = 1;
  attribList[4] = 0x3038;
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar4 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_eglDisplay = pvVar4;
  pvVar5 = eglu::chooseSingleConfig(stack0xffffffffffffffe8,this->m_eglDisplay,local_38);
  this->m_eglConfig = pvVar5;
  this_00 = (this->super_TestCase).m_eglTestCtx;
  local_3c = (deUint32)glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,(ApiType)local_3c);
  if (((this->m_config).useFenceSync & 1U) != 0) {
    requireEGLExtension(stack0xffffffffffffffe8,this->m_eglDisplay,"EGL_KHR_fence_sync");
  }
  if (((this->m_config).serverSync & 1U) != 0) {
    requireEGLExtension(stack0xffffffffffffffe8,this->m_eglDisplay,"EGL_KHR_wait_sync");
  }
  if ((this->m_config).resourceType == RESOURCETYPE_IMAGE) {
    requireEGLExtension(stack0xffffffffffffffe8,this->m_eglDisplay,"EGL_KHR_image_base");
    requireEGLExtension(stack0xffffffffffffffe8,this->m_eglDisplay,"EGL_KHR_gl_texture_2D_image");
  }
  pEVar6 = (EGLThread *)operator_new(200);
  pLVar2 = stack0xffffffffffffffe8;
  dVar3 = ::deInt32Hash(this->m_seed);
  GLES2ThreadTest::EGLThread::EGLThread(pEVar6,pLVar2,&this->m_gl,dVar3);
  local_48 = pEVar6;
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ::push_back(&this->m_threads,&local_48);
  pEVar6 = (EGLThread *)operator_new(200);
  pLVar2 = stack0xffffffffffffffe8;
  dVar3 = ::deInt32Hash(this->m_seed * 200);
  GLES2ThreadTest::EGLThread::EGLThread(pEVar6,pLVar2,&this->m_gl,dVar3);
  contex1.m_state = (SharedPtrStateBase *)pEVar6;
  std::
  vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
  ::push_back(&this->m_threads,(value_type *)&contex1.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&contex2.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&surface1.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)&surface2.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)local_a0);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar7;
  pCVar8 = (CreateContext *)operator_new(0x68);
  local_b1 = 1;
  pvVar4 = this->m_eglDisplay;
  pvVar5 = this->m_eglConfig;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&local_b0);
  GLES2ThreadTest::CreateContext::CreateContext
            (pCVar8,pvVar4,pvVar5,&local_b0,
             (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&contex2.m_state);
  local_b1 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar8);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_b0);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar1 = *ppEVar7;
  pCVar8 = (CreateContext *)operator_new(0x68);
  local_c9 = 1;
  pvVar4 = this->m_eglDisplay;
  pvVar5 = this->m_eglConfig;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            (&local_c8,(SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&contex2.m_state);
  GLES2ThreadTest::CreateContext::CreateContext
            (pCVar8,pvVar4,pvVar5,&local_c8,
             (SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&surface1.m_state);
  local_c9 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar8);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_c8);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar7;
  pCVar9 = (CreatePBufferSurface *)operator_new(0x60);
  GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
            (pCVar9,this->m_eglDisplay,this->m_eglConfig,400,400,
             (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)&surface2.m_state);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar9);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar1 = *ppEVar7;
  pCVar9 = (CreatePBufferSurface *)operator_new(0x60);
  GLES2ThreadTest::CreatePBufferSurface::CreatePBufferSurface
            (pCVar9,this->m_eglDisplay,this->m_eglConfig,400,400,
             (SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)local_a0);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pCVar9);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar7;
  pMVar10 = (MakeCurrent *)operator_new(0x60);
  local_f1 = 1;
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar6 = *ppEVar7;
  pvVar4 = this->m_eglDisplay;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            (&local_e0,(SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)&surface2.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            (&local_f0,(SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&contex2.m_state);
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar10,pEVar6,pvVar4,&local_e0,&local_f0);
  local_f1 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pMVar10);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_f0);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr(&local_e0);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar1 = *ppEVar7;
  pMVar10 = (MakeCurrent *)operator_new(0x60);
  local_119 = 1;
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar6 = *ppEVar7;
  pvVar4 = this->m_eglDisplay;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            (&local_108,(SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)local_a0);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            (&local_118,(SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&surface1.m_state);
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar10,pEVar6,pvVar4,&local_108,&local_118);
  local_119 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pMVar10);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_118);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr(&local_108);
  if (((this->m_config).useFenceSync & 1U) != 0) {
    ppEVar7 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,0);
    pEVar1 = *ppEVar7;
    pIVar11 = (InitGLExtension *)operator_new(0x58);
    GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar11,"GL_OES_EGL_sync");
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pIVar11);
    ppEVar7 = std::
              vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ::operator[](&this->m_threads,1);
    pEVar1 = *ppEVar7;
    pIVar11 = (InitGLExtension *)operator_new(0x58);
    GLES2ThreadTest::InitGLExtension::InitGLExtension(pIVar11,"GL_OES_EGL_sync");
    tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pIVar11);
  }
  switch((this->m_config).resourceType) {
  case RESOURCETYPE_BUFFER:
    addBufferOperations(this);
    break;
  case RESOURCETYPE_TEXTURE:
    addTextureOperations(this);
    break;
  case RESOURCETYPE_VERTEX_SHADER:
    addShaderOperations(this,0x8b31);
    break;
  case RESOURCETYPE_FRAGMENT_SHADER:
    addShaderOperations(this,0x8b30);
    break;
  case RESOURCETYPE_PROGRAM:
    addProgramOperations(this);
    break;
  case RESOURCETYPE_IMAGE:
    addImageOperations(this);
  }
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar7;
  pMVar10 = (MakeCurrent *)operator_new(0x60);
  local_141 = 1;
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar6 = *ppEVar7;
  pvVar4 = this->m_eglDisplay;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(&local_130);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&local_140);
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar10,pEVar6,pvVar4,&local_130,&local_140);
  local_141 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pMVar10);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_140);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr(&local_130);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar1 = *ppEVar7;
  pMVar10 = (MakeCurrent *)operator_new(0x60);
  local_169 = 1;
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar6 = *ppEVar7;
  pvVar4 = this->m_eglDisplay;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(&local_158);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(&local_168);
  GLES2ThreadTest::MakeCurrent::MakeCurrent(pMVar10,pEVar6,pvVar4,&local_158,&local_168);
  local_169 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pMVar10);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_168);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr(&local_158);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar7;
  pDVar12 = (DestroyContext *)operator_new(0x48);
  local_181 = 1;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            (&local_180,(SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&contex2.m_state);
  GLES2ThreadTest::DestroyContext::DestroyContext(pDVar12,&local_180);
  local_181 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_180);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar1 = *ppEVar7;
  pDVar12 = (DestroyContext *)operator_new(0x48);
  local_199 = 1;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr
            (&local_198,(SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&surface1.m_state);
  GLES2ThreadTest::DestroyContext::DestroyContext(pDVar12,&local_198);
  local_199 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar12);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr(&local_198);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,0);
  pEVar1 = *ppEVar7;
  pDVar13 = (DestroySurface *)operator_new(0x50);
  local_1b1 = 1;
  pvVar4 = this->m_eglDisplay;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            (&local_1b0,(SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)&surface2.m_state);
  GLES2ThreadTest::DestroySurface::DestroySurface(pDVar13,pvVar4,&local_1b0);
  local_1b1 = 0;
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr(&local_1b0);
  ppEVar7 = std::
            vector<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
            ::operator[](&this->m_threads,1);
  pEVar1 = *ppEVar7;
  pDVar13 = (DestroySurface *)operator_new(0x50);
  pvVar4 = this->m_eglDisplay;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr
            (&local_1c8,(SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)local_a0);
  GLES2ThreadTest::DestroySurface::DestroySurface(pDVar13,pvVar4,&local_1c8);
  tcu::ThreadUtil::Thread::addOperation(&pEVar1->super_Thread,(Operation *)pDVar13);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr(&local_1c8);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)local_a0);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *)&surface2.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&surface1.m_state);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::~SharedPtr
            ((SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *)&contex2.m_state);
  return extraout_EAX;
}

Assistant:

void GLES2ThreadedSharingTest::init (void)
{
	const Library& egl = m_eglTestCtx.getLibrary();

	const EGLint attribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_ALPHA_SIZE,			1,
		EGL_NONE
	};

	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= eglu::chooseSingleConfig(egl, m_eglDisplay, attribList);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	// Check extensions
	if (m_config.useFenceSync)
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_fence_sync");

	if (m_config.serverSync)
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_wait_sync");

	if (m_config.resourceType == TestConfig::RESOURCETYPE_IMAGE)
	{
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_image_base");
		requireEGLExtension(egl, m_eglDisplay, "EGL_KHR_gl_texture_2D_image");
	}

	// Create threads
	m_threads.push_back(new GLES2ThreadTest::EGLThread(egl, m_gl, deInt32Hash(m_seed)));
	m_threads.push_back(new GLES2ThreadTest::EGLThread(egl, m_gl, deInt32Hash(m_seed*200)));

	SharedPtr<GLES2ThreadTest::GLES2Context> contex1;
	SharedPtr<GLES2ThreadTest::GLES2Context> contex2;

	SharedPtr<GLES2ThreadTest::Surface> surface1;
	SharedPtr<GLES2ThreadTest::Surface> surface2;

	// Create contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::CreateContext(m_eglDisplay, m_eglConfig, SharedPtr<GLES2ThreadTest::GLES2Context>(), contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::CreateContext(m_eglDisplay, m_eglConfig, contex1, contex2));

	// Create surfaces
	m_threads[0]->addOperation(new GLES2ThreadTest::CreatePBufferSurface(m_eglDisplay, m_eglConfig, 400, 400, surface1));
	m_threads[1]->addOperation(new GLES2ThreadTest::CreatePBufferSurface(m_eglDisplay, m_eglConfig, 400, 400, surface2));

	// Make current contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, surface1, contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[1], m_eglDisplay, surface2, contex2));
	// Operations to check fence sync support
	if (m_config.useFenceSync)
	{
		m_threads[0]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_sync"));
		m_threads[1]->addOperation(new GLES2ThreadTest::InitGLExtension("GL_OES_EGL_sync"));
	}


	switch (m_config.resourceType)
	{
		case TestConfig::RESOURCETYPE_BUFFER:
			addBufferOperations();
			break;

		case TestConfig::RESOURCETYPE_TEXTURE:
			addTextureOperations();
			break;

		case TestConfig::RESOURCETYPE_IMAGE:
			addImageOperations();
			break;

		case TestConfig::RESOURCETYPE_VERTEX_SHADER:
			addShaderOperations(GL_VERTEX_SHADER);
			break;

		case TestConfig::RESOURCETYPE_FRAGMENT_SHADER:
			addShaderOperations(GL_FRAGMENT_SHADER);
			break;

		case TestConfig::RESOURCETYPE_PROGRAM:
			addProgramOperations();
			break;

		default:
			DE_ASSERT(false);
	}

	// Relaese contexts
	m_threads[0]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, SharedPtr<GLES2ThreadTest::Surface>(), SharedPtr<GLES2ThreadTest::GLES2Context>()));
	m_threads[1]->addOperation(new GLES2ThreadTest::MakeCurrent(*m_threads[0], m_eglDisplay, SharedPtr<GLES2ThreadTest::Surface>(), SharedPtr<GLES2ThreadTest::GLES2Context>()));

	// Destory context
	m_threads[0]->addOperation(new GLES2ThreadTest::DestroyContext(contex1));
	m_threads[1]->addOperation(new GLES2ThreadTest::DestroyContext(contex2));

	// Destroy surfaces
	m_threads[0]->addOperation(new GLES2ThreadTest::DestroySurface(m_eglDisplay, surface1));
	m_threads[1]->addOperation(new GLES2ThreadTest::DestroySurface(m_eglDisplay, surface2));
}